

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  Curl_tree *pCVar1;
  timeval i;
  undefined1 local_f0 [8];
  sigpipe_ignore pipe_st;
  CURLMcode result;
  timeval now;
  Curl_tree *t;
  Curl_easy *pCStack_28;
  CURLMcode returncode;
  Curl_easy *data;
  int *running_handles_local;
  Curl_multi *multi_local;
  
  t._4_4_ = CURLM_OK;
  i = curlx_tvnow();
  if ((multi == (Curl_multi *)0x0) || (multi->type != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else {
    for (pCStack_28 = multi->easyp; pCStack_28 != (Curl_easy *)0x0; pCStack_28 = pCStack_28->next) {
      sigpipe_ignore(pCStack_28,(sigpipe_ignore *)local_f0);
      pipe_st._156_4_ = multi_runsingle(multi,i,pCStack_28);
      sigpipe_restore((sigpipe_ignore *)local_f0);
      if (pipe_st._156_4_ != 0) {
        t._4_4_ = pipe_st._156_4_;
      }
    }
    do {
      pCVar1 = Curl_splaygetbest(i,multi->timetree,(Curl_tree **)&now.tv_usec);
      multi->timetree = pCVar1;
      if (now.tv_usec != 0) {
        add_next_timeout(i,multi,*(Curl_easy **)(now.tv_usec + 0x30));
      }
    } while (now.tv_usec != 0);
    *running_handles = multi->num_alive;
    if (t._4_4_ < CURLM_BAD_HANDLE) {
      update_timer(multi);
    }
    multi_local._4_4_ = t._4_4_;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode=CURLM_OK;
  struct Curl_tree *t;
  struct timeval now = Curl_tvnow();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  data=multi->easyp;
  while(data) {
    CURLMcode result;
    SIGPIPE_VARIABLE(pipe_st);

    sigpipe_ignore(data, &pipe_st);
    result = multi_runsingle(multi, now, data);
    sigpipe_restore(&pipe_st);

    if(result)
      returncode = result;

    data = data->next; /* operate on next handle */
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    update_timer(multi);

  return returncode;
}